

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::StrictMock<MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::StrictMock
          (StrictMock<MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_> *this)

{
  internal::
  FunctionMocker<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
  ::FunctionMocker(&(this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
                    gmock2_Write_1248);
  this->_vptr_StrictMock = (_func_int **)&PTR__StrictMock_00261a30;
  Mock::FailUninterestingCalls
            (&this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }